

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O1

size_t phosg::parse_size(char *str)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  
  lVar5 = 0;
  bVar2 = *str;
  while ((int)(char)bVar2 - 0x30U < 10) {
    lVar5 = (ulong)((int)(char)bVar2 - 0x30U) + lVar5 * 10;
    pbVar1 = (byte *)str + 1;
    str = (char *)((byte *)str + 1);
    bVar2 = *pbVar1;
  }
  dVar7 = 0.0;
  if (bVar2 == 0x2e) {
    pbVar1 = (byte *)str + 1;
    str = (char *)((byte *)str + 1);
    uVar3 = (int)(char)*pbVar1 - 0x30;
    if (uVar3 < 10) {
      dVar8 = 0.1;
      do {
        dVar7 = dVar7 + (double)(int)uVar3 * dVar8;
        dVar8 = dVar8 * 0.1;
        pbVar1 = (byte *)str + 1;
        str = (char *)((byte *)str + 1);
        uVar3 = (int)(char)*pbVar1 - 0x30;
      } while (uVar3 < 10);
    }
  }
  for (; bVar2 = *str, bVar2 == 0x20; str = (char *)((byte *)str + 1)) {
  }
  if (bVar2 < 0x65) {
    switch(bVar2) {
    case 0x45:
switchD_0010d364_caseD_45:
      lVar4 = 0x1000000000000000;
      goto LAB_0010d3c6;
    case 0x46:
    case 0x48:
    case 0x49:
    case 0x4a:
    case 0x4c:
    case 0x4e:
    case 0x4f:
      break;
    case 0x47:
switchD_0010d364_caseD_47:
      lVar4 = 0x40000000;
      goto LAB_0010d3c6;
    case 0x4b:
switchD_0010d364_caseD_4b:
      lVar4 = 0x400;
      goto LAB_0010d3c6;
    case 0x4d:
switchD_0010d364_caseD_4d:
      lVar4 = 0x100000;
      goto LAB_0010d3c6;
    case 0x50:
switchD_0010d364_caseD_50:
      lVar4 = 0x4000000000000;
      goto LAB_0010d3c6;
    default:
      if (bVar2 == 0x54) {
LAB_0010d3bc:
        lVar4 = 0x10000000000;
        goto LAB_0010d3c6;
      }
    }
  }
  else {
    switch(bVar2) {
    case 0x65:
      goto switchD_0010d364_caseD_45;
    case 0x66:
    case 0x68:
    case 0x69:
    case 0x6a:
    case 0x6c:
    case 0x6e:
    case 0x6f:
      break;
    case 0x67:
      goto switchD_0010d364_caseD_47;
    case 0x6b:
      goto switchD_0010d364_caseD_4b;
    case 0x6d:
      goto switchD_0010d364_caseD_4d;
    case 0x70:
      goto switchD_0010d364_caseD_50;
    default:
      if (bVar2 == 0x74) goto LAB_0010d3bc;
    }
  }
  lVar4 = 1;
LAB_0010d3c6:
  uVar6 = (ulong)(dVar7 * (double)lVar4);
  return ((long)(dVar7 * (double)lVar4 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f | uVar6) +
         lVar5 * lVar4;
}

Assistant:

size_t parse_size(const char* str) {
  // input is like [0-9](\.[0-9]+)? *[KkMmGgTtPpEe]?[Bb]?
  // fortunately this can just be parsed left-to-right
  double fractional_part = 0.0;
  size_t integer_part = 0;
  size_t unit_scale = 1;
  for (; isdigit(*str); str++) {
    integer_part = integer_part * 10 + (*str - '0');
  }
  if (*str == '.') {
    str++;
    double factor = 0.1;
    for (; isdigit(*str); str++) {
      fractional_part += factor * (*str - '0');
      factor *= 0.1;
    }
  }
  for (; *str == ' '; str++) {
  }
#if SIZE_T_BITS >= 16
  if (*str == 'K' || *str == 'k') {
    unit_scale = KB_SIZE;
#if SIZE_T_BITS >= 32
  } else if (*str == 'M' || *str == 'm') {
    unit_scale = MB_SIZE;
  } else if (*str == 'G' || *str == 'g') {
    unit_scale = GB_SIZE;
#if SIZE_T_BITS == 64
  } else if (*str == 'T' || *str == 't') {
    unit_scale = TB_SIZE;
  } else if (*str == 'P' || *str == 'p') {
    unit_scale = PB_SIZE;
  } else if (*str == 'E' || *str == 'e') {
    unit_scale = EB_SIZE;
#endif
#endif
  }
#endif

  return integer_part * unit_scale + static_cast<size_t>(fractional_part * unit_scale);
}